

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

int input(WINDOW *win,char *str,int len,bool cont)

{
  int iVar1;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int y;
  int x;
  int x_1;
  int y_1;
  int c;
  int i;
  int xmax;
  int ymax;
  bool cont_local;
  int len_local;
  char *str_local;
  WINDOW *win_local;
  
  if (win == (WINDOW *)0x0) {
    local_44 = -1;
  }
  else {
    local_44 = win->_maxy + 1;
  }
  i = local_44;
  if (win == (WINDOW *)0x0) {
    local_48 = -1;
  }
  else {
    local_48 = win->_maxx + 1;
  }
  y_1 = 0;
  do {
    iVar1 = wgetch(win);
    if ((iVar1 == 0x157) || (iVar1 == 10)) {
      if (0 < y_1) {
        return y_1;
      }
    }
    else if (iVar1 == 0x107) {
      if (0 < y_1) {
        y_1 = y_1 + -1;
        str[y_1] = '\0';
        std::mutex::lock(&mutwin);
        if (win == (WINDOW *)0x0) {
          local_4c = -1;
        }
        else {
          local_4c = (int)win->_cury;
        }
        x = local_4c;
        if (win == (WINDOW *)0x0) {
          local_50 = -1;
        }
        else {
          local_50 = (int)win->_curx;
        }
        y = local_50;
        if (local_50 < 1) {
          if (0 < local_4c) {
            x = local_4c + -1;
            y = ncolums + -1;
            iVar1 = wmove(win,x);
            if (iVar1 != -1) {
              waddch(win,0x20);
            }
          }
        }
        else {
          y = local_50 + -1;
          iVar1 = wmove(win,local_4c);
          if (iVar1 != -1) {
            waddch(win,0x20);
          }
        }
        wmove(win,x,y);
        std::mutex::unlock(&mutwin);
      }
    }
    else if ((((iVar1 < 0x109) || (0x114 < iVar1)) && ((iVar1 < 0x102 || (0x105 < iVar1)))) &&
            (((iVar1 != 0x1b && (iVar1 != 9)) && (y_1 < len)))) {
      str[y_1] = (char)iVar1;
      waddch(win,iVar1);
      y_1 = y_1 + 1;
    }
    std::mutex::lock(&mutwin);
    if (win == (WINDOW *)0x0) {
      local_54 = -1;
      local_58 = -1;
    }
    else {
      local_54 = (int)win->_cury;
      local_58 = (int)win->_curx;
    }
    if ((local_54 == i) && (local_58 == local_48)) {
      i = i + 1;
      wresize(win,i,local_48);
    }
    if (cont) {
      wattr_on(win,0x6600,0);
      mvwprintw(win,0,ncolums + -10,"%d/%d",y_1,len);
      wattr_off(win,0x6600,0);
    }
    wmove(win,local_54,local_58);
    wrefresh(win);
    std::mutex::unlock(&mutwin);
  } while( true );
}

Assistant:

int  input(WINDOW *win, char *str, int len, bool cont) {
  int ymax, xmax;
  getmaxyx(win, ymax, xmax);
  int i = 0;
  while(1) {
    int c = wgetch(win);
    if(c == KEY_ENTER || c == 10) {
      if (i > 0)
        break;
    }
    else if (c == KEY_BACKSPACE) {
      if (i > 0) {
        str[--i] = '\0';
        int y, x;
        mutwin.lock();
        getyx(win, y, x);
        if (x > 0) {
          mvwaddch(win, y, --x, ' ');
        }
        else if (y > 0) {
          y--;
          x = ncolums;
          mvwaddch(win, y, --x, ' ');
        }
        wmove(win, y, x);
        mutwin.unlock();
      }
    }
    else if (!((265 <= c && 276 >=c) || (258 <= c && 261 >= c ) || (c == 27) || c == 9)) {
      if (i < len) {
        str[i++] = c;
        waddch(win, c);
      }
    }
    int x, y;

    mutwin.lock();
    getyx(win, y, x);
    if(y == ymax && x == xmax) {
      wresize(win, ++ymax, xmax);
    }
    if (cont) {
      wattron(win, COLOR_PAIR(102));
      mvwprintw(win, 0, ncolums - 10, "%d/%d", i, len);
      wattroff(win, COLOR_PAIR(102));
    }
    wmove(win, y,x);
    wrefresh(win);
    mutwin.unlock();
  }
  return (i);
}